

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O3

int32_t __thiscall
icu_63::RuleBasedBreakIterator::preceding(RuleBasedBreakIterator *this,int32_t offset)

{
  UText *ut;
  int iVar1;
  int64_t iVar2;
  UErrorCode status;
  UErrorCode local_1c;
  
  ut = &this->fText;
  iVar2 = utext_nativeLength_63(ut);
  if (iVar2 < offset) {
    iVar1 = (*(this->super_BreakIterator).super_UObject._vptr_UObject[0xb])(this);
    return iVar1;
  }
  utext_setNativeIndex_63(ut,(long)offset);
  iVar2 = utext_getNativeIndex_63(ut);
  local_1c = U_ZERO_ERROR;
  BreakCache::preceding(this->fBreakCache,(int32_t)iVar2,&local_1c);
  return -(uint)(this->fDone != '\0') | this->fPosition;
}

Assistant:

int32_t RuleBasedBreakIterator::preceding(int32_t offset) {
    if (offset > utext_nativeLength(&fText)) {
        return last();
    }

    // Move requested offset to a code point start. It might be on a trail surrogate,
    // or on a trail byte if the input is UTF-8.

    utext_setNativeIndex(&fText, offset);
    int32_t adjustedOffset = static_cast<int32_t>(utext_getNativeIndex(&fText));

    UErrorCode status = U_ZERO_ERROR;
    fBreakCache->preceding(adjustedOffset, status);
    return fDone ? UBRK_DONE : fPosition;
}